

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O2

string * __thiscall
kws::Parser::FindMemberFunction
          (string *__return_storage_ptr__,Parser *this,string *buffer,size_t start,size_t end,
          size_t *pos)

{
  byte __lhs;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  size_t pos_00;
  size_t sVar5;
  string line;
  string local_90 [32];
  string functionLine;
  string local_50;
  
  uVar3 = std::__cxx11::string::find((char *)buffer,0x161d46);
  do {
    if (end <= uVar3) {
      *pos = 0xffffffffffffffff;
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&line);
      return __return_storage_ptr__;
    }
    lVar4 = GetLineNumber(this,uVar3,true);
    GetLine_abi_cxx11_(&line,this,lVar4 - 1);
    lVar4 = std::__cxx11::string::find((char *)&line,0x162e4e);
    if ((lVar4 == -1) && (lVar4 = std::__cxx11::string::find((char *)&line,0x162e5a), lVar4 == -1))
    {
      do {
        do {
          uVar3 = uVar3 - 1;
          if (uVar3 == 0xffffffffffffffff) {
            pos_00 = 0xffffffffffffffff;
            goto LAB_00148b6c;
          }
          pos_00 = uVar3;
          if (uVar3 < start) goto LAB_00148b6c;
        } while ((buffer->_M_dataplus)._M_p[uVar3] != ')');
        std::__cxx11::string::string((string *)&local_50,"",(allocator *)&functionLine);
        pos_00 = FindClosingChar(this,')','(',uVar3,true,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      } while ((pos_00 == 0) ||
              (bVar1 = IsInFunction(this,pos_00,(buffer->_M_dataplus)._M_p), bVar1));
LAB_00148b6c:
      uVar3 = pos_00 - 1;
      *pos = uVar3;
      if (uVar3 < end && start < uVar3) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&functionLine)
        ;
        bVar1 = false;
        for (sVar5 = *pos; (sVar5 != 0xffffffffffffffff && (start < sVar5)); sVar5 = sVar5 - 1) {
          __lhs = (buffer->_M_dataplus)._M_p[sVar5];
          if (((ulong)__lhs < 0x2b) && ((0x44100002600U >> ((ulong)__lhs & 0x3f) & 1) != 0)) {
            if (bVar1) break;
            bVar1 = false;
          }
          else {
            std::operator+(&functionLine,__lhs,__return_storage_ptr__);
            std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&functionLine);
            std::__cxx11::string::~string((string *)&functionLine);
            bVar1 = true;
          }
        }
        lVar4 = GetLineNumber(this,pos_00,true);
        GetLine_abi_cxx11_(&functionLine,this,lVar4 - 1);
        bVar2 = false;
        lVar4 = std::__cxx11::string::find((char *)&functionLine,0x1622aa);
        bVar1 = true;
        if (lVar4 == -1) {
          bVar2 = false;
          lVar4 = std::__cxx11::string::find((char *)&functionLine,0x162e4e);
          if (lVar4 == -1) {
            bVar2 = false;
            lVar4 = std::__cxx11::string::find((char *)&functionLine,0x162e5a);
            if (lVar4 == -1) {
              bVar2 = false;
              lVar4 = std::__cxx11::string::find((char *)&functionLine,0x162e64);
              if (lVar4 == -1) {
                lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x161d52);
                if (lVar4 != -1) {
                  std::__cxx11::string::substr((ulong)local_90,(ulong)__return_storage_ptr__);
                  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_90);
                  std::__cxx11::string::~string(local_90);
                }
                lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x162e43);
                if (lVar4 != -1) {
                  std::__cxx11::string::substr((ulong)local_90,(ulong)__return_storage_ptr__);
                  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_90);
                  std::__cxx11::string::~string(local_90);
                }
                bVar2 = std::operator!=(__return_storage_ptr__,"void");
                bVar1 = !bVar2;
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&functionLine);
        if (bVar2 == false) {
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        if (!bVar1) {
          std::__cxx11::string::~string((string *)&line);
          return __return_storage_ptr__;
        }
      }
    }
    uVar3 = std::__cxx11::string::find((char *)buffer,0x161d46);
    std::__cxx11::string::~string((string *)&line);
  } while( true );
}

Assistant:

std::string Parser::FindMemberFunction(std::string & buffer, size_t start, size_t end,size_t& pos)
{
  size_t posSemicolon = buffer.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We check that we don't have the keyword __attribute__
    std::string line = this->GetLine(this->GetLineNumber(posSemicolon,true)-1);
    if((line.find("_attribute_") != std::string::npos)
      || (line.find(" operator") != std::string::npos)
      )
      {
      posSemicolon = buffer.find(";",posSemicolon+1);
      continue;
      }

    // We try to find a (
    size_t i=posSemicolon-1;
    bool inFunction = true;
    while(i != std::string::npos && i>=start && inFunction)
      {
      if(buffer[i] == ')')
        {
        size_t close = this->FindClosingChar(')','(',i,true);
        if(close>0 && !this->IsInFunction(close,buffer.c_str()))
          {
          i = close;
          inFunction = false;
          break;
          }
        }
      i--;
      }

    pos = i-1;

    // If we have a match we extract the word
    if(pos != std::string::npos && pos>start && pos<end)
      {
      std::string functionName = "";
      bool inWord = false;
      size_t index=pos;
      for(;index!=std::string::npos && index>start;index--)
        {
        if(buffer[index] != ' ' && buffer[index] != '\t'
           && buffer[index] != '\r' && buffer[index] != '\n' && buffer[index] != '*' && buffer[index] != '&')
          {
          inWord = true;
          functionName = buffer[index]+functionName;
          }
        else if(inWord)
          {
          break;
          }
        }
      // Check that this is not a #define (tricky)
      std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);
      if(functionLine.find("#define") == std::string::npos
         && functionLine.find("_attribute_") == std::string::npos
         && functionLine.find(" operator") == std::string::npos
         && functionLine.find("friend ") == std::string::npos)
        {
        // If we have a class definition: Test():Base
        // we return the correct
        size_t posf = functionName.find("(",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }
        posf = functionName.find(":",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }

        // If the function name is void we skip because it means
        // this is a member variable function (see bug 5086)
        if(functionName != "void")
          {
          return functionName;
          }
        }
      }
    posSemicolon = buffer.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}